

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 ExtractNonSpaceToken(char **pzIn,char *zEnd,SyString *pOut)

{
  byte *pbVar1;
  ushort **ppuVar2;
  byte bVar3;
  sxi32 sVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  
  pbVar5 = (byte *)*pzIn;
  sVar4 = -0x12;
  bVar7 = pbVar5 < zEnd;
  if (bVar7) {
    bVar3 = *pbVar5;
    if (bVar3 < 0xc0) {
      ppuVar2 = __ctype_b_loc();
      pbVar5 = pbVar5 + 1;
      do {
        if ((*(byte *)((long)*ppuVar2 + (long)(char)bVar3 * 2 + 1) & 0x20) == 0) break;
        bVar7 = pbVar5 < zEnd;
        if (pbVar5 == (byte *)zEnd) {
          return -0x12;
        }
        bVar3 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar3 < 0xc0);
      pbVar5 = pbVar5 + -1;
    }
    pbVar1 = pbVar5;
    pbVar6 = pbVar5;
    if (bVar7) {
      while (((pbVar1 < zEnd &&
              (bVar3 = *pbVar1, pbVar6 = pbVar1, (ulong)(long)(char)bVar3 < 0xffffffffffffffc0)) &&
             (ppuVar2 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar2 + (long)(char)bVar3 * 2 + 1) & 0x20) == 0))) {
        pbVar1 = pbVar1 + 1;
        pbVar6 = (byte *)zEnd;
      }
      pOut->zString = (char *)pbVar5;
      pOut->nByte = (int)pbVar6 - (int)pbVar5;
      *pzIn = (char *)pbVar6;
      sVar4 = 0;
    }
  }
  return sVar4;
}

Assistant:

static sxi32 ExtractNonSpaceToken(const char **pzIn, const char *zEnd, SyString *pOut)
{
	const char *zIn = *pzIn;
	const char *zPtr;
	/* Ignore leading white spaces */
	while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0]) ){
		zIn++;
	}
	if( zIn >= zEnd ){
		/* End of input */
		return SXERR_EOF;
	}
	zPtr = zIn;
	/* Extract the token */
	while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && !SyisSpace(zIn[0]) ){
		zIn++;
	}
	SyStringInitFromBuf(pOut, zPtr, zIn-zPtr);
	/* Synchronize pointers */
	*pzIn = zIn;
	/* Return to the caller */
	return SXRET_OK;
}